

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

uint64_t __thiscall kratos::IRNode::index_of(IRNode *this,IRNode *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IRNode *n;
  uint64_t index;
  IRNode *node_local;
  IRNode *this_local;
  
  n = (IRNode *)0x0;
  while ((iVar1 = (*this->_vptr_IRNode[1])(), n < (IRNode *)CONCAT44(extraout_var,iVar1) &&
         (iVar1 = (*this->_vptr_IRNode[2])(this,n),
         (IRNode *)CONCAT44(extraout_var_00,iVar1) != node))) {
    n = (IRNode *)((long)&n->_vptr_IRNode + 1);
  }
  return (uint64_t)n;
}

Assistant:

uint64_t IRNode::index_of(const kratos::IRNode *node) {
    uint64_t index;
    for (index = 0; index < child_count(); index++) {
        auto *n = get_child(index);
        if (n == node) break;
    }
    return index;
}